

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu34x_com.c
# Opt level: O3

void vdpu34x_setup_rcb(Vdpu34xRegCommonAddr *reg,MppDev dev,MppBuffer buf,Vdpu34xRcbInfo *info)

{
  RK_U32 RVar1;
  
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu34x_setup_rcb");
  reg->reg141_rcb_fbc_base = RVar1;
  reg->reg133_rcb_intra_base = RVar1;
  reg->reg134_rcb_transd_row_base = RVar1;
  reg->reg135_rcb_transd_col_base = RVar1;
  reg->reg136_rcb_streamd_row_base = RVar1;
  reg->reg137_rcb_inter_row_base = RVar1;
  reg->reg138_rcb_inter_col_base = RVar1;
  reg->reg139_rcb_dblk_base = RVar1;
  reg->reg140_rcb_sao_base = RVar1;
  reg->reg142_rcb_filter_col_base = RVar1;
  if (info->offset != 0) {
    mpp_dev_set_reg_offset(dev,0x8b,info->offset);
  }
  if (info[1].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x85,info[1].offset);
  }
  if (info[2].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x86,info[2].offset);
  }
  if (info[3].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x88,info[3].offset);
  }
  if (info[4].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x89,info[4].offset);
  }
  if (info[5].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x8c,info[5].offset);
  }
  if (info[6].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x8d,info[6].offset);
  }
  if (info[7].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x87,info[7].offset);
  }
  if (info[8].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x8a,info[8].offset);
  }
  if (info[9].offset != 0) {
    mpp_dev_set_reg_offset(dev,0x8e,info[9].offset);
    return;
  }
  return;
}

Assistant:

void vdpu34x_setup_rcb(Vdpu34xRegCommonAddr *reg, MppDev dev, MppBuffer buf, Vdpu34xRcbInfo *info)
{
    RK_S32 fd = mpp_buffer_get_fd(buf);

    reg->reg139_rcb_dblk_base           = fd;
    reg->reg133_rcb_intra_base          = fd;
    reg->reg134_rcb_transd_row_base     = fd;
    reg->reg136_rcb_streamd_row_base    = fd;
    reg->reg137_rcb_inter_row_base      = fd;
    reg->reg140_rcb_sao_base            = fd;
    reg->reg141_rcb_fbc_base            = fd;
    reg->reg135_rcb_transd_col_base     = fd;
    reg->reg138_rcb_inter_col_base      = fd;
    reg->reg142_rcb_filter_col_base     = fd;

    if (info[RCB_DBLK_ROW].offset)
        mpp_dev_set_reg_offset(dev, 139, info[RCB_DBLK_ROW].offset);
    if (info[RCB_INTRA_ROW].offset)
        mpp_dev_set_reg_offset(dev, 133, info[RCB_INTRA_ROW].offset);
    if (info[RCB_TRANSD_ROW].offset)
        mpp_dev_set_reg_offset(dev, 134, info[RCB_TRANSD_ROW].offset);
    if (info[RCB_STRMD_ROW].offset)
        mpp_dev_set_reg_offset(dev, 136, info[RCB_STRMD_ROW].offset);
    if (info[RCB_INTER_ROW].offset)
        mpp_dev_set_reg_offset(dev, 137, info[RCB_INTER_ROW].offset);
    if (info[RCB_SAO_ROW].offset)
        mpp_dev_set_reg_offset(dev, 140, info[RCB_SAO_ROW].offset);
    if (info[RCB_FBC_ROW].offset)
        mpp_dev_set_reg_offset(dev, 141, info[RCB_FBC_ROW].offset);
    if (info[RCB_TRANSD_COL].offset)
        mpp_dev_set_reg_offset(dev, 135, info[RCB_TRANSD_COL].offset);
    if (info[RCB_INTER_COL].offset)
        mpp_dev_set_reg_offset(dev, 138, info[RCB_INTER_COL].offset);
    if (info[RCB_FILT_COL].offset)
        mpp_dev_set_reg_offset(dev, 142, info[RCB_FILT_COL].offset);
}